

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O0

sha256_hash *
libtorrent::merkle_root_scratch
          (sha256_hash *__return_storage_ptr__,span<const_libtorrent::digest32<256L>_> leaves,
          int num_leafs,sha256_hash pad,
          vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          *scratch_space)

{
  sha256_hash sVar1;
  int iVar2;
  index_type iVar3;
  digest32<256L> *pdVar4;
  ulong uVar5;
  hasher256 *phVar6;
  reference pvVar7;
  span<const_libtorrent::digest32<256L>_> local_128;
  span<const_char> local_118;
  span<const_char> local_108;
  hasher256 local_f8;
  sha256_hash local_f0;
  span<const_char> local_d0;
  span<const_char> local_c0;
  hasher256 local_b0;
  sha256_hash local_a8;
  span<const_char> local_88 [2];
  span<const_char> local_68;
  hasher256 local_58;
  sha256_hash local_4c;
  int local_2c;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> *pvStack_28;
  int i;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
  *scratch_space_local;
  undefined1 auStack_18 [4];
  int num_leafs_local;
  span<const_libtorrent::digest32<256L>_> leaves_local;
  
  leaves_local.m_ptr = (digest32<256L> *)leaves.m_len;
  _auStack_18 = leaves.m_ptr;
  pvStack_28 = scratch_space;
  scratch_space_local._4_4_ = num_leafs;
  iVar3 = span<const_libtorrent::digest32<256L>_>::size
                    ((span<const_libtorrent::digest32<256L>_> *)auStack_18);
  ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::resize
            (scratch_space,iVar3 + 1U >> 1);
  if (scratch_space_local._4_4_ == 1) {
    pdVar4 = span<const_libtorrent::digest32<256L>_>::operator[]
                       ((span<const_libtorrent::digest32<256L>_> *)auStack_18,0);
    *(undefined8 *)(__return_storage_ptr__->m_number)._M_elems =
         *(undefined8 *)(pdVar4->m_number)._M_elems;
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 2) =
         *(undefined8 *)((pdVar4->m_number)._M_elems + 2);
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 4) =
         *(undefined8 *)((pdVar4->m_number)._M_elems + 4);
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 6) =
         *(undefined8 *)((pdVar4->m_number)._M_elems + 6);
  }
  else {
    for (; 1 < scratch_space_local._4_4_; scratch_space_local._4_4_ = scratch_space_local._4_4_ / 2)
    {
      for (local_2c = 0; iVar2 = local_2c,
          uVar5 = span<const_libtorrent::digest32<256L>_>::size
                            ((span<const_libtorrent::digest32<256L>_> *)auStack_18),
          iVar2 < (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / 2);
          local_2c = local_2c + 1) {
        lcrypto::hasher256::hasher256(&local_58);
        pdVar4 = span<const_libtorrent::digest32<256L>_>::operator[]
                           ((span<const_libtorrent::digest32<256L>_> *)auStack_18,
                            (long)(local_2c * 2));
        span<char_const>::span<libtorrent::digest32<256l>,char,void>
                  ((span<char_const> *)&local_68,pdVar4);
        phVar6 = lcrypto::hasher256::update(&local_58,local_68);
        pdVar4 = span<const_libtorrent::digest32<256L>_>::operator[]
                           ((span<const_libtorrent::digest32<256L>_> *)auStack_18,
                            (long)(local_2c * 2 + 1));
        span<char_const>::span<libtorrent::digest32<256l>,char,void>
                  ((span<char_const> *)local_88,pdVar4);
        phVar6 = lcrypto::hasher256::update(phVar6,local_88[0]);
        lcrypto::hasher256::final(&local_4c,phVar6);
        pvVar7 = ::std::
                 vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
                 operator[](pvStack_28,(long)local_2c);
        *(undefined8 *)(pvVar7->m_number)._M_elems = local_4c.m_number._M_elems._0_8_;
        *(undefined8 *)((pvVar7->m_number)._M_elems + 2) = local_4c.m_number._M_elems._8_8_;
        *(undefined8 *)((pvVar7->m_number)._M_elems + 4) = local_4c.m_number._M_elems._16_8_;
        *(undefined8 *)((pvVar7->m_number)._M_elems + 6) = local_4c.m_number._M_elems._24_8_;
        lcrypto::hasher256::~hasher256(&local_58);
      }
      uVar5 = span<const_libtorrent::digest32<256L>_>::size
                        ((span<const_libtorrent::digest32<256L>_> *)auStack_18);
      if ((uVar5 & 1) != 0) {
        lcrypto::hasher256::hasher256(&local_b0);
        pdVar4 = span<const_libtorrent::digest32<256L>_>::operator[]
                           ((span<const_libtorrent::digest32<256L>_> *)auStack_18,
                            (long)(local_2c * 2));
        span<char_const>::span<libtorrent::digest32<256l>,char,void>
                  ((span<char_const> *)&local_c0,pdVar4);
        phVar6 = lcrypto::hasher256::update(&local_b0,local_c0);
        span<char_const>::span<libtorrent::digest32<256l>,char,void>
                  ((span<char_const> *)&local_d0,&pad);
        phVar6 = lcrypto::hasher256::update(phVar6,local_d0);
        lcrypto::hasher256::final(&local_a8,phVar6);
        pvVar7 = ::std::
                 vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
                 operator[](pvStack_28,(long)local_2c);
        *(undefined8 *)(pvVar7->m_number)._M_elems = local_a8.m_number._M_elems._0_8_;
        *(undefined8 *)((pvVar7->m_number)._M_elems + 2) = local_a8.m_number._M_elems._8_8_;
        *(undefined8 *)((pvVar7->m_number)._M_elems + 4) = local_a8.m_number._M_elems._16_8_;
        *(undefined8 *)((pvVar7->m_number)._M_elems + 6) = local_a8.m_number._M_elems._24_8_;
        lcrypto::hasher256::~hasher256(&local_b0);
        local_2c = local_2c + 1;
      }
      lcrypto::hasher256::hasher256(&local_f8);
      span<char_const>::span<libtorrent::digest32<256l>,char,void>
                ((span<char_const> *)&local_108,&pad);
      phVar6 = lcrypto::hasher256::update(&local_f8,local_108);
      span<char_const>::span<libtorrent::digest32<256l>,char,void>
                ((span<char_const> *)&local_118,&pad);
      phVar6 = lcrypto::hasher256::update(phVar6,local_118);
      lcrypto::hasher256::final(&local_f0,phVar6);
      sVar1 = pad;
      pad.m_number._M_elems[0] = local_f0.m_number._M_elems[0];
      pad.m_number._M_elems[1] = local_f0.m_number._M_elems[1];
      pad = sVar1;
      lcrypto::hasher256::~hasher256(&local_f8);
      pdVar4 = ::std::
               vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
               data(pvStack_28);
      span<const_libtorrent::digest32<256L>_>::span(&local_128,pdVar4,(long)local_2c);
      _auStack_18 = local_128.m_ptr;
      leaves_local.m_ptr = (digest32<256L> *)local_128.m_len;
    }
    pvVar7 = ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ::operator[](pvStack_28,0);
    *(undefined8 *)(__return_storage_ptr__->m_number)._M_elems =
         *(undefined8 *)(pvVar7->m_number)._M_elems;
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 2) =
         *(undefined8 *)((pvVar7->m_number)._M_elems + 2);
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 4) =
         *(undefined8 *)((pvVar7->m_number)._M_elems + 4);
    *(undefined8 *)((__return_storage_ptr__->m_number)._M_elems + 6) =
         *(undefined8 *)((pvVar7->m_number)._M_elems + 6);
  }
  return __return_storage_ptr__;
}

Assistant:

sha256_hash merkle_root_scratch(span<sha256_hash const> leaves
		, int num_leafs, sha256_hash pad
		, std::vector<sha256_hash>& scratch_space)
	{
		TORRENT_ASSERT(((num_leafs - 1) & num_leafs) == 0);

		scratch_space.resize(std::size_t(leaves.size() + 1) / 2);
		TORRENT_ASSERT(num_leafs > 0);

		if (num_leafs == 1) return leaves[0];

		while (num_leafs > 1)
		{
			int i = 0;
			for (; i < int(leaves.size()) / 2; ++i)
			{
				scratch_space[std::size_t(i)] = hasher256()
					.update(leaves[i * 2])
					.update(leaves[i * 2 + 1])
					.final();
			}
			if (leaves.size() & 1)
			{
				// if we have an odd number of leaves, compute the boundary hash
				// here, that spans both a payload-hash and a pad hash
				scratch_space[std::size_t(i)] = hasher256()
					.update(leaves[i * 2])
					.update(pad)
					.final();
				++i;
			}
			// we don't have to copy any pad hashes into memory, they are implied
			// just keep track of the current layer's pad hash
			pad = hasher256().update(pad).update(pad).final();

			// step one level up
			leaves = span<sha256_hash const>(scratch_space.data(), i);
			num_leafs /= 2;
		}

		return scratch_space[0];
	}